

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall
cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Extend_impl
          (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *this,iterator it,
          BuildsystemDirectoryStateType *t)

{
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *pcVar1;
  size_type sVar2;
  size_type sVar3;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *pcVar4;
  BuildsystemDirectoryStateType *t_local;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *this_local;
  iterator it_local;
  
  it_local.Tree = (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)it.Position;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
  sVar3 = std::
          vector<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
          ::size(&this->Data);
  pcVar1 = it_local.Tree;
  if (sVar2 != sVar3) {
    __assert_fail("this->UpPositions.size() == this->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmLinkedTree.h"
                  ,0x99,
                  "iterator cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Extend_impl(iterator, T) [T = cmState::BuildsystemDirectoryStateType]"
                 );
  }
  pcVar4 = (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
  if (pcVar1 <= pcVar4) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->UpPositions,(value_type_conflict *)&it_local);
    std::
    vector<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
    ::push_back(&this->Data,t);
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
    iterator::iterator((iterator *)&it_local.Position,this,sVar2);
    return stack0xffffffffffffffe8;
  }
  __assert_fail("it.Position <= this->UpPositions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmLinkedTree.h"
                ,0x9a,
                "iterator cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Extend_impl(iterator, T) [T = cmState::BuildsystemDirectoryStateType]"
               );
}

Assistant:

iterator Extend_impl(iterator it, T t)
  {
    assert(this->UpPositions.size() == this->Data.size());
    assert(it.Position <= this->UpPositions.size());
    this->UpPositions.push_back(it.Position);
    this->Data.push_back(t);
    return iterator(this, this->UpPositions.size());
  }